

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_array.c
# Opt level: O0

ares_status_t ares_array_move(ares_array_t *arr,size_t dest_idx,size_t src_idx)

{
  size_t nmembers;
  void *src_ptr;
  void *dest_ptr;
  size_t src_idx_local;
  size_t dest_idx_local;
  ares_array_t *arr_local;
  
  if (((arr == (ares_array_t *)0x0) || (arr->alloc_cnt <= dest_idx)) || (arr->alloc_cnt <= src_idx))
  {
    arr_local._4_4_ = ARES_EFORMERR;
  }
  else if (dest_idx == src_idx) {
    arr_local._4_4_ = ARES_SUCCESS;
  }
  else if ((src_idx < dest_idx) && (arr->alloc_cnt < arr->cnt + (dest_idx - src_idx))) {
    arr_local._4_4_ = ARES_EFORMERR;
  }
  else {
    memmove((void *)((long)arr->arr + dest_idx * arr->member_size),
            (void *)((long)arr->arr + src_idx * arr->member_size),
            (arr->cnt - (src_idx - arr->offset)) * arr->member_size);
    arr_local._4_4_ = ARES_SUCCESS;
  }
  return arr_local._4_4_;
}

Assistant:

static ares_status_t ares_array_move(ares_array_t *arr, size_t dest_idx,
                                     size_t src_idx)
{
  void       *dest_ptr;
  const void *src_ptr;
  size_t      nmembers;

  if (arr == NULL || dest_idx >= arr->alloc_cnt || src_idx >= arr->alloc_cnt) {
    return ARES_EFORMERR;
  }

  /* Nothing to do */
  if (dest_idx == src_idx) {
    return ARES_SUCCESS;
  }

  dest_ptr = (unsigned char *)arr->arr + (dest_idx * arr->member_size);
  src_ptr  = (unsigned char *)arr->arr + (src_idx * arr->member_size);

  /* Check to make sure shifting to the right won't overflow our allocation
   * boundary */
  if (dest_idx > src_idx && arr->cnt + (dest_idx - src_idx) > arr->alloc_cnt) {
    return ARES_EFORMERR;
  }

  nmembers = arr->cnt - (src_idx - arr->offset);
  memmove(dest_ptr, src_ptr, nmembers * arr->member_size);

  return ARES_SUCCESS;
}